

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::expand
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_t capacity)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  size_t *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  ulong local_28;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arr;
  size_t capacity_local;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = capacity;
  uVar4 = SUB168(auVar3 * ZEXT816(0x20),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  psVar5 = (size_t *)operator_new__(uVar7);
  *psVar5 = capacity;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar5 + 1);
  if (capacity != 0) {
    local_48 = pbVar6;
    do {
      std::__cxx11::string::string((string *)local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pbVar6 + capacity);
  }
  for (local_28 = 0; local_28 < this->mSize; local_28 = local_28 + 1) {
    std::__cxx11::string::operator=
              ((string *)(pbVar6 + local_28),
               (string *)(this->mData + (this->mFront + local_28) % this->mCap));
  }
  pbVar1 = this->mData;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar2 = *(long *)((long)&pbVar1[-1].field_2 + 8);
    this_00 = pbVar1 + lVar2;
    while (pbVar1 != this_00) {
      this_00 = this_00 + -1;
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete__((void *)((long)&pbVar1[-1].field_2 + 8),lVar2 * 0x20 + 8);
  }
  this->mData = pbVar6;
  this->mCap = capacity;
  this->mFront = 0;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[(mFront + i) % mCap];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
      mFront = 0;
    }